

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cc
# Opt level: O2

void __thiscall re2c::Input::~Input(Input *this)

{
  FILE *__stream;
  
  __stream = (FILE *)this->file;
  if ((__stream != (FILE *)0x0) && (__stream != _stdin)) {
    fclose(__stream);
  }
  std::__cxx11::string::~string((string *)&this->file_name);
  return;
}

Assistant:

Input::~Input ()
{
	if (file != NULL && file != stdin)
	{
		fclose (file);
	}
}